

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

char * FindModuleCodeWithSourceLocation(ExpressionContext *ctx,char *position)

{
  ByteCode *code;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = ctx->code;
  if ((position < pcVar3) || (sVar1 = strlen(pcVar3), pcVar3 + sVar1 < position)) {
    if ((ctx->imports).count == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)0x0;
      uVar4 = 0;
      do {
        code = (ctx->imports).data[uVar4]->bytecode;
        pcVar2 = FindSource(code);
        if ((pcVar2 <= position) && (position <= pcVar2 + code->sourceSize)) {
          if ((ctx->imports).count <= (uint)uVar4) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ModuleData *, 128>::operator[](unsigned int) [T = ModuleData *, N = 128]"
                         );
          }
          pcVar3 = FindSource((ctx->imports).data[uVar4]->bytecode);
          return pcVar3;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ctx->imports).count);
    }
  }
  return pcVar3;
}

Assistant:

const char* FindModuleCodeWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	if(position >= ctx.code && position <= ctx.code + strlen(ctx.code))
		return ctx.code;

	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return FindSource(ctx.imports[i]->bytecode);
	}

	return NULL;
}